

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<unsigned_long>::dispose(ArrayBuilder<unsigned_long> *this)

{
  unsigned_long *firstElement;
  RemoveConst<unsigned_long> *pRVar1;
  unsigned_long *puVar2;
  unsigned_long *endCopy;
  unsigned_long *posCopy;
  unsigned_long *ptrCopy;
  ArrayBuilder<unsigned_long> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  puVar2 = this->endPtr;
  if (firstElement != (unsigned_long *)0x0) {
    this->ptr = (unsigned_long *)0x0;
    this->pos = (RemoveConst<unsigned_long> *)0x0;
    this->endPtr = (unsigned_long *)0x0;
    ArrayDisposer::dispose<unsigned_long>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 3,
               (long)puVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }